

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int set_block_is_active(uchar *active_map_4x4,int mi_cols,int mi_rows,int sbi_col,int sbi_row)

{
  int local_44;
  int local_40;
  int y;
  int x;
  int col_max;
  int row_max;
  int c;
  int r;
  int num_4x4;
  int sbi_row_local;
  int sbi_col_local;
  int mi_rows_local;
  int mi_cols_local;
  uchar *active_map_4x4_local;
  
  if (mi_rows + sbi_row * -0x10 < 0x11) {
    local_40 = mi_rows + sbi_row * -0x10;
  }
  else {
    local_40 = 0x10;
  }
  if (mi_cols + sbi_col * -0x10 < 0x11) {
    local_44 = mi_cols + sbi_col * -0x10;
  }
  else {
    local_44 = 0x10;
  }
  x = 0;
  do {
    if (local_40 <= x) {
      return 0;
    }
    for (y = 0; y < local_44; y = y + 4) {
      if (active_map_4x4[(sbi_row * 0x10 + x) * mi_cols + sbi_col * 0x10 + y] == '\0') {
        return 1;
      }
    }
    x = x + 4;
  } while( true );
}

Assistant:

static int set_block_is_active(unsigned char *const active_map_4x4, int mi_cols,
                               int mi_rows, int sbi_col, int sbi_row) {
  int num_4x4 = 16;
  int r = sbi_row << 4;
  int c = sbi_col << 4;
  const int row_max = AOMMIN(num_4x4, mi_rows - r);
  const int col_max = AOMMIN(num_4x4, mi_cols - c);
  // Active map is set for 16x16 blocks, so only need to
  // check over16x16,
  for (int x = 0; x < row_max; x += 4) {
    for (int y = 0; y < col_max; y += 4) {
      if (active_map_4x4[(r + x) * mi_cols + (c + y)] == AM_SEGMENT_ID_ACTIVE)
        return 1;
    }
  }
  return 0;
}